

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O0

void Gia_ObjComputeTruthTableTest(Gia_Man_t *p)

{
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  bool bVar4;
  int local_2c;
  int i;
  abctime clk;
  uint *pTruth;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  aVar2 = Abc_Clock();
  local_2c = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(p);
    bVar4 = false;
    if (local_2c < iVar1) {
      pTruth = (uint *)Gia_ManCo(p,local_2c);
      bVar4 = (Gia_Obj_t *)pTruth != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    Gia_ObjComputeTruthTable(p,(Gia_Obj_t *)pTruth);
    local_2c = local_2c + 1;
  }
  aVar3 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar3 - aVar2);
  return;
}

Assistant:

void Gia_ObjComputeTruthTableTest( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    unsigned * pTruth;
    abctime clk = Abc_Clock();
    int i;
    Gia_ManForEachPo( p, pObj, i )
    {
        pTruth = (unsigned *)Gia_ObjComputeTruthTable( p, pObj );
//        Extra_PrintHex( stdout, pTruth, Gia_ManPiNum(p) ); printf( "\n" );
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}